

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O1

void __thiscall
SuiteDataDictionaryTests::TestaddHeaderField::~TestaddHeaderField(TestaddHeaderField *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(addHeaderField)
{
  DataDictionary object;
  CHECK( !object.isHeaderField( 56 ) );
  CHECK( !object.isHeaderField( 49 ) );
  object.addHeaderField( 56, true );
  object.addHeaderField( 49, true );
  CHECK( object.isHeaderField( 56 ) );
  CHECK( object.isHeaderField( 49 ) );
}